

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproperty_p.h
# Opt level: O0

void QPropertyBindingPrivate::destroyAndFreeMemory(QPropertyBindingPrivate *priv)

{
  bool bVar1;
  QPropertyBindingPrivate *in_RDI;
  QPropertyBindingPrivate *unaff_retaddr;
  
  bVar1 = hasCustomVTable(in_RDI);
  if (bVar1) {
    (*in_RDI->vtable->destroy)(in_RDI);
  }
  else {
    ~QPropertyBindingPrivate(unaff_retaddr);
    if (in_RDI != (QPropertyBindingPrivate *)0x0) {
      operator_delete__(in_RDI);
    }
  }
  return;
}

Assistant:

static void destroyAndFreeMemory(QPropertyBindingPrivate *priv) {
        if (priv->hasCustomVTable()) {
            // special hack for QQmlPropertyBinding which has a
            // different memory layout than normal QPropertyBindings
            priv->vtable->destroy(priv);
        } else{
            priv->~QPropertyBindingPrivate();
            delete[] reinterpret_cast<std::byte *>(priv);
        }
    }